

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic3_impl.c
# Opt level: O0

void commit_h_x4(uint8_t **digest,commitments_t *C,picnic_instance_t *params)

{
  long in_RDX;
  size_t i;
  hash_context_x4 ctx;
  size_t in_stack_fffffffffffffca8;
  uint8_t **buffer;
  hash_context_x4 *in_stack_fffffffffffffcb0;
  size_t in_stack_fffffffffffffcc8;
  uint8_t *in_stack_fffffffffffffcd0;
  uint8_t *in_stack_fffffffffffffcd8;
  uint8_t *in_stack_fffffffffffffce0;
  uint8_t *in_stack_fffffffffffffce8;
  hash_context_x4 *in_stack_fffffffffffffcf0;
  
  hash_init_x4(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
  for (buffer = (uint8_t **)0x0; buffer < (uint8_t **)(ulong)*(byte *)(in_RDX + 0xb);
      buffer = (uint8_t **)((long)buffer + 1)) {
    hash_update_x4_4(in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,in_stack_fffffffffffffce0,
                     in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
  }
  hash_final_x4((hash_context_x4 *)0x146f07);
  hash_squeeze_x4(in_stack_fffffffffffffcb0,buffer,0x146f27);
  return;
}

Assistant:

static void commit_h_x4(uint8_t** digest, const commitments_t* C, const picnic_instance_t* params) {
  hash_context_x4 ctx;

  hash_init_x4(&ctx, params->digest_size);
  for (size_t i = 0; i < params->num_MPC_parties; i++) {
    hash_update_x4_4(&ctx, C[0].hashes[i], C[1].hashes[i], C[2].hashes[i], C[3].hashes[i],
                     params->digest_size);
  }
  hash_final_x4(&ctx);
  hash_squeeze_x4(&ctx, digest, params->digest_size);
  hash_clear_x4(&ctx);
}